

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_defaultConstructorRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_defaultConstructorRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_108;
  Message local_100;
  storage_type local_f2;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  Message local_d8 [2];
  bad_optional_access *anon_var_0;
  char *pcStack_c0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_98;
  Message local_90;
  storage_type local_82;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_50 [3];
  Message local_38;
  storage_type local_2a;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 make;
  optTyped_defaultConstructorRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this_local;
  
  local_2a = (storage_type)
             TestBody::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = mp::opt::operator_cast_to_bool((opt *)&local_2a);
  local_29 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,(AssertionResult *)0x209ab6,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x11b,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_82 = (storage_type)
             TestBody::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = mp::opt<bool,_mp::opt_default_policy<bool>_>::has_value
                    ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_82);
  local_81 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg,(internal *)local_80,(AssertionResult *)"make().has_value()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x11c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_msg);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff40,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff40);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      anon_var_0._6_1_ =
           (storage_type)
           TestBody::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
      mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                ((opt<bool,_mp::opt_default_policy<bool>_> *)((long)&anon_var_0 + 6));
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0019c294;
    pcStack_c0 = 
    "Expected: make().value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x11d,pcStack_c0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_d8);
LAB_0019c294:
  local_f2 = (storage_type)
             TestBody::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&gtest_ar_.message_.ptr_ + 7));
  local_f1 = mp::opt<bool,mp::opt_default_policy<bool>>::value_or<bool_const&>
                       ((opt<bool,mp::opt_default_policy<bool>> *)&local_f2,
                        &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).
                         value_2);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_f0,"this->value_2","make().value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2,
             &local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x11e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [] { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}